

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorDatabase::FindAllPackageNames
          (DescriptorDatabase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  pointer pbVar1;
  int iVar2;
  LogMessage *pLVar3;
  pointer value;
  bool bVar4;
  LogFinisher local_191;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  set;
  LogMessage local_140;
  FileDescriptorProto file_proto;
  
  file_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  file_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  file_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output;
  iVar2 = (*this->_vptr_DescriptorDatabase[6])();
  if ((char)iVar2 == '\0') {
    bVar4 = false;
  }
  else {
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &set._M_t._M_impl.super__Rb_tree_header._M_header;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    FileDescriptorProto::FileDescriptorProto(&file_proto);
    pbVar1 = file_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = file_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar4 = value == pbVar1, !bVar4;
        value = value + 1) {
      FileDescriptorProto::Clear(&file_proto);
      iVar2 = (*this->_vptr_DescriptorDatabase[2])(this,value,&file_proto);
      if ((char)iVar2 == '\0') {
        internal::LogMessage::LogMessage
                  (&local_140,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x51);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_140,"File not found in database (unexpected): ");
        pLVar3 = internal::LogMessage::operator<<(pLVar3,value);
        internal::LogFinisher::operator=(&local_191,pLVar3);
        internal::LogMessage::~LogMessage(&local_140);
        goto LAB_003876de;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&set,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)file_proto.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              (local_190,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (local_190 + 8),
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )set._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&set._M_t._M_impl.super__Rb_tree_header);
LAB_003876de:
    FileDescriptorProto::~FileDescriptorProto(&file_proto);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&set._M_t);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&file_names);
  return bVar4;
}

Assistant:

bool DescriptorDatabase::FindAllPackageNames(std::vector<std::string>* output) {
  return ForAllFileProtos(
      this,
      [](const FileDescriptorProto& file_proto, std::set<std::string>* set) {
        set->insert(file_proto.package());
      },
      output);
}